

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hello_world.cpp
# Opt level: O0

int main(void)

{
  ostream *poVar1;
  format local_28 [32];
  
  format::string<std::__cxx11::string,char_const[9],char_const(&)[6],char_const(&)[6]>
            (local_28,(char (*) [9])"{1} {0}!",(char (*) [6])"world",(char (*) [6])"hello");
  poVar1 = std::operator<<((ostream *)&std::cout,(string *)local_28);
  std::operator<<(poVar1,"\n");
  std::__cxx11::string::~string((string *)local_28);
  return 0;
}

Assistant:

int main() {
  std::cout << format::string("{1} {0}!", "world", "hello") << "\n";
}